

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.h
# Opt level: O2

void __thiscall
slang::ast::ForLoopStatement::visitExprs<slang::ast::DriverVisitor&>
          (ForLoopStatement *this,DriverVisitor *visitor)

{
  pointer ppEVar1;
  size_t sVar2;
  long lVar3;
  
  ppEVar1 = (this->initializers)._M_ptr;
  sVar2 = (this->initializers)._M_extent._M_extent_value;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    Expression::visit<slang::ast::DriverVisitor&>(*(Expression **)((long)ppEVar1 + lVar3),visitor);
  }
  if (this->stopExpr != (Expression *)0x0) {
    Expression::visit<slang::ast::DriverVisitor&>(this->stopExpr,visitor);
  }
  ppEVar1 = (this->steps)._M_ptr;
  sVar2 = (this->steps)._M_extent._M_extent_value;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    Expression::visit<slang::ast::DriverVisitor&>(*(Expression **)((long)ppEVar1 + lVar3),visitor);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto init : initializers)
            init->visit(visitor);
        if (stopExpr)
            stopExpr->visit(visitor);
        for (auto step : steps)
            step->visit(visitor);
    }